

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O2

void load_log(char *filename,int lines,cpu_log_t *buffer)

{
  FILE *__stream;
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  cpu_log_t *pcVar5;
  cpu_log_t *pcVar6;
  byte bVar7;
  char buf [10];
  cpu_log_t log;
  
  bVar7 = 0;
  __stream = fopen(filename,"rb");
  uVar3 = 0;
  uVar4 = (ulong)(uint)lines;
  if (lines < 1) {
    uVar4 = uVar3;
  }
  for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    fseek(__stream,2,1);
    fgets(buf,9,__stream);
    lVar1 = strtol(buf,(char **)0x0,0x10);
    log.address = (uint32_t)lVar1;
    fseek(__stream,3,1);
    fgets(buf,9,__stream);
    lVar1 = strtol(buf,(char **)0x0,0x10);
    log.instruction = (uint32_t)lVar1;
    fseek(__stream,3,1);
    fgets(buf,9,__stream);
    lVar1 = strtol(buf,(char **)0x0,0x10);
    log.cpsr.raw = (uint32_t)lVar1;
    for (lVar1 = 3; lVar1 != 0x13; lVar1 = lVar1 + 1) {
      fseek(__stream,3,1);
      fgets(buf,9,__stream);
      lVar2 = strtol(buf,(char **)0x0,0x10);
      log.r[lVar1 + -3] = (uint32_t)lVar2;
    }
    fseek(__stream,1,1);
    fgets(buf,4,__stream);
    lVar1 = strtol(buf,(char **)0x0,10);
    log.cycles = (uint32_t)lVar1;
    fseek(__stream,1,1);
    pcVar5 = &log;
    pcVar6 = buffer + uVar3;
    for (lVar1 = 0x14; lVar1 != 0; lVar1 = lVar1 + -1) {
      pcVar6->address = pcVar5->address;
      pcVar5 = (cpu_log_t *)((long)pcVar5 + (ulong)bVar7 * -8 + 4);
      pcVar6 = (cpu_log_t *)((long)pcVar6 + (ulong)bVar7 * -8 + 4);
    }
  }
  return;
}

Assistant:

void load_log(const char* filename, int lines, cpu_log_t* buffer) {
    FILE* fp = fopen(filename, "rb");
    char buf[10];
    for (int l = 0; l < lines; l++) {
        cpu_log_t log;
        fseek(fp, 2, SEEK_CUR); // Skip 0x
        fgets(buf, 9, fp);
        log.address = strtol(buf, NULL, 16);

        fseek(fp, 3, SEEK_CUR); // skip ,0x
        fgets(buf, 9, fp);
        log.instruction = strtol(buf, NULL, 16);

        fseek(fp, 3, SEEK_CUR); // skip ,0x
        fgets(buf, 9, fp);
        log.cpsr.raw = strtol(buf, NULL, 16);

        for (int r = 0; r < 16; r++) {
            fseek(fp, 3, SEEK_CUR); // skip ,0x
            fgets(buf, 9, fp);
            log.r[r] = strtol(buf, NULL, 16);
        }

        fseek(fp, 1, SEEK_CUR); // skip ,
        fgets(buf, 4, fp);
        log.cycles = strtol(buf, NULL, 10);

        fseek(fp, 1, SEEK_CUR); // Skip newline character

        buffer[l] = log;
    }
}